

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O0

void * add_records(add_records_args *args)

{
  long lVar1;
  int iVar2;
  spki_record *spki_record;
  long in_FS_OFFSET;
  int ret;
  spki_record *record;
  int i;
  add_records_args *args_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  printf("Add %i records: ASN [%i..%i]\n",(ulong)(uint)args->count,(ulong)(uint)args->start_asn,
         (ulong)((args->count + args->start_asn) - 1));
  record._4_4_ = args->start_asn;
  while( true ) {
    if (args->count + args->start_asn <= record._4_4_) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (void *)0x0;
      }
      __stack_chk_fail();
    }
    spki_record = create_record(record._4_4_,record._4_4_,record._4_4_,(rtr_socket *)0x0);
    iVar2 = spki_table_add_entry(args->table,spki_record);
    if (iVar2 != 0) break;
    free(spki_record);
    record._4_4_ = record._4_4_ + 1;
  }
  __assert_fail("ret == SPKI_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x54,"void *add_records(struct add_records_args *)");
}

Assistant:

static void *add_records(struct add_records_args *args)
{
	printf("Add %i records: ASN [%i..%i]\n", args->count, args->start_asn, args->count + args->start_asn - 1);
	for (int i = args->start_asn; i < args->count + args->start_asn; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);
		int ret = spki_table_add_entry(args->table, record);

		assert(ret == SPKI_SUCCESS);
		free(record);
	}

	return NULL;
}